

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
ON_TextureMapping::GetTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_SimpleArray<ON_3fPoint> *T,ON_Xform *mesh_xform,
          bool bLazy,ON_SimpleArray<int> *Tside)

{
  ON_2fPoint *pOVar1;
  uint uVar2;
  ON_TextureCoordinates *pOVar3;
  ON_2fPoint *pOVar4;
  double dVar5;
  float fVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ON_3fPoint *pOVar11;
  double *m;
  double *m_00;
  ON_Mesh *mesh_00;
  ON_RenderMeshInfo *pRenderMeshInfo;
  long lVar12;
  int *__s;
  ON_Xform *pOVar13;
  CMeshClosestPointMapper *pCVar14;
  ulong new_capacity;
  ON_Xform *pOVar15;
  int *piVar16;
  byte bVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ON_2fPointArray temp_tcs;
  ON_3dPoint tc;
  ON_Xform matP;
  ON_Xform matN;
  ON_Xform N_xform;
  ON_Xform P_xform;
  CMeshClosestPointMapper meshMapper;
  ON_3fVector *local_b80;
  ON_3dPoint local_b68;
  ON_3dVector local_b48;
  ON_SimpleArray<ON_2fPoint> local_b28;
  ON_3dPoint local_b10;
  ON_Xform local_af8;
  ON_Xform local_a78;
  ON_Xform local_9f8;
  ON_Xform local_978;
  ON_Xform local_8f8;
  CMeshClosestPointMapper local_878;
  
  bVar17 = 0;
  if ((Tside != (ON_SimpleArray<int> *)0x0) && (-1 < Tside->m_capacity)) {
    Tside->m_count = 0;
  }
  uVar2 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  new_capacity = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    return false;
  }
  if (bLazy) {
    lVar10 = (long)(mesh->m_TC).m_count;
    if (0 < lVar10) {
      lVar12 = 0;
      do {
        pOVar3 = (mesh->m_TC).m_a;
        if ((uVar2 == *(uint *)((long)&(pOVar3->m_T).m_count + lVar12)) &&
           (bVar7 = HasMatchingTextureCoordinates
                              (this,(ON_MappingTag *)
                                    ((pOVar3->m_tag).m_mapping_id.Data4 + lVar12 + -8),mesh_xform),
           bVar7)) {
          ON_SimpleArray<ON_3fPoint>::operator=
                    (T,(ON_SimpleArray<ON_3fPoint> *)
                       ((long)&(((mesh->m_TC).m_a)->m_T)._vptr_ON_SimpleArray + lVar12));
          return true;
        }
        lVar12 = lVar12 + 0xb8;
      } while (lVar10 * 0xb8 - lVar12 != 0);
    }
    bVar7 = ON_Mesh::HasTextureCoordinates(mesh);
    if ((bVar7) && (bVar7 = HasMatchingTextureCoordinates(this,&mesh->m_Ttag,mesh_xform), bVar7)) {
      uVar8 = T->m_capacity;
      if (uVar8 < uVar2) {
        ON_SimpleArray<ON_3fPoint>::SetCapacity(T,new_capacity);
        uVar8 = T->m_capacity;
      }
      if ((int)uVar2 <= (int)uVar8) {
        T->m_count = uVar2;
      }
      pOVar11 = T->m_a;
      pOVar4 = (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
      lVar10 = 0;
      do {
        pOVar1 = pOVar4 + lVar10;
        fVar6 = pOVar1->y;
        pOVar11->x = pOVar1->x;
        pOVar11->y = fVar6;
        pOVar11->z = 0.0;
        pOVar11 = pOVar11 + 1;
        lVar10 = lVar10 + 1;
      } while (uVar2 != (uint)lVar10);
      return true;
    }
  }
  if (this->m_type == srfp_mapping) {
    uVar8 = T->m_capacity;
    if (uVar8 < uVar2) {
      ON_SimpleArray<ON_3fPoint>::SetCapacity(T,new_capacity);
      uVar8 = T->m_capacity;
    }
    if ((int)uVar2 <= (int)uVar8) {
      T->m_count = uVar2;
    }
    pOVar11 = T->m_a;
    if (0 < (int)uVar8 && pOVar11 != (ON_3fPoint *)0x0) {
      memset(pOVar11,0,(ulong)uVar8 * 0xc);
      pOVar11 = T->m_a;
    }
    bVar7 = GetSPTCHelper(mesh,this,&pOVar11->x,3);
    return bVar7;
  }
  ON_3dVector::ON_3dVector(&local_b48,0.0,0.0,0.0);
  pOVar11 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
  bVar7 = ON_Mesh::HasVertexNormals(mesh);
  if (bVar7) {
    local_b80 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
  }
  else {
    local_b80 = (ON_3fVector *)0x0;
  }
  uVar8 = T->m_capacity;
  if (uVar8 < uVar2) {
    ON_SimpleArray<ON_3fPoint>::SetCapacity(T,new_capacity);
    uVar8 = T->m_capacity;
  }
  if ((int)uVar2 <= (int)uVar8) {
    T->m_count = uVar2;
  }
  if (Tside == (ON_SimpleArray<int> *)0x0) {
    __s = (int *)0x0;
  }
  else {
    uVar8 = Tside->m_capacity;
    if (uVar8 < uVar2) {
      ON_SimpleArray<int>::SetCapacity(Tside,new_capacity);
      uVar8 = Tside->m_capacity;
    }
    if ((int)uVar2 <= (int)uVar8) {
      Tside->m_count = uVar2;
    }
    __s = Tside->m_a;
    memset(__s,0,new_capacity * 4);
  }
  pOVar13 = &ON_Xform::IdentityTransformation;
  pOVar15 = &local_8f8;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    pOVar15->m_xform[0][0] = pOVar13->m_xform[0][0];
    pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar17 * -2 + 1) * 8);
    pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar17 * -2 + 1) * 8);
  }
  pOVar13 = &ON_Xform::IdentityTransformation;
  pOVar15 = &local_978;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    pOVar15->m_xform[0][0] = pOVar13->m_xform[0][0];
    pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar17 * -2 + 1) * 8);
    pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar17 * -2 + 1) * 8);
  }
  if (((mesh_xform != (ON_Xform *)0x0) && (bVar7 = ON_Xform::IsZero(mesh_xform), !bVar7)) &&
     (bVar7 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar7)) {
    dVar5 = ON_Xform::GetMappingXforms(mesh_xform,&local_8f8,&local_978);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      m = ON_Xform::operator[](&local_8f8,0);
      m_00 = ON_Xform::operator[](&local_978,0);
      goto LAB_004dbacd;
    }
  }
  m = (double *)0x0;
  m_00 = (double *)0x0;
LAB_004dbacd:
  if (((this->m_projection == clspt_projection) &&
      ((this->m_type == brep_mapping_primitive || (this->m_type == mesh_mapping_primitive)))) &&
     ((this->m_mapping_primitive).super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0)) {
    ON_2fPointArray::ON_2fPointArray((ON_2fPointArray *)&local_b28);
    pOVar13 = &this->m_Pxyz;
    pOVar15 = &local_a78;
    for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
      pOVar15->m_xform[0][0] = pOVar13->m_xform[0][0];
      pOVar13 = (ON_Xform *)((long)pOVar13 + (ulong)bVar17 * -0x10 + 8);
      pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar17 * -2 + 1) * 8);
    }
    pOVar13 = &this->m_Nxyz;
    pOVar15 = &local_9f8;
    for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
      pOVar15->m_xform[0][0] = pOVar13->m_xform[0][0];
      pOVar13 = (ON_Xform *)((long)pOVar13 + (ulong)bVar17 * -0x10 + 8);
      pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar17 * -2 + 1) * 8);
    }
    if (m != (double *)0x0) {
      ON_Xform::ON_Xform(&local_af8,m);
      ON_Xform::operator*((ON_Xform *)&local_878,&local_a78,&local_af8);
      pCVar14 = &local_878;
      pOVar13 = &local_a78;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        pOVar13->m_xform[0][0] =
             (double)(pCVar14->super_IClosestPointMapper)._vptr_IClosestPointMapper;
        pCVar14 = (CMeshClosestPointMapper *)((long)pCVar14 + ((ulong)bVar17 * -2 + 1) * 8);
        pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar17 * -2 + 1) * 8);
      }
    }
    if (m_00 != (double *)0x0) {
      ON_Xform::ON_Xform(&local_af8,m_00);
      ON_Xform::operator*((ON_Xform *)&local_878,&local_9f8,&local_af8);
      pCVar14 = &local_878;
      pOVar13 = &local_9f8;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        pOVar13->m_xform[0][0] =
             (double)(pCVar14->super_IClosestPointMapper)._vptr_IClosestPointMapper;
        pCVar14 = (CMeshClosestPointMapper *)((long)pCVar14 + ((ulong)bVar17 * -2 + 1) * 8);
        pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar17 * -2 + 1) * 8);
      }
    }
    if ((this->m_type == mesh_mapping_primitive) &&
       (mesh_00 = ON_Mesh::Cast((this->m_mapping_primitive).
                                super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr), mesh_00 != (ON_Mesh *)0x0)) {
      pRenderMeshInfo = ON_Mesh::GetRenderMeshInfo(mesh);
      CMeshClosestPointMapper::CMeshClosestPointMapper
                (&local_878,mesh_00,&mesh_00->m_T,pRenderMeshInfo,&local_a78);
      bVar7 = ProjectTextureCoordinates
                        (&local_878.super_IClosestPointMapper,mesh,(ON_2fPointArray *)&local_b28,
                         (double *)&local_a78,(double *)&local_9f8);
      CMeshClosestPointMapper::~CMeshClosestPointMapper(&local_878);
      if (bVar7) {
        if (0 < local_b28.m_count) {
          lVar10 = 0;
          lVar12 = 0;
          do {
            ON_3dPoint::ON_3dPoint
                      ((ON_3dPoint *)&local_878,(double)local_b28.m_a[lVar12].x,
                       (double)local_b28.m_a[lVar12].y,0.0);
            ON_Xform::operator*((ON_3dPoint *)&local_af8,&this->m_uvw,(ON_3dPoint *)&local_878);
            local_878.m_tc = (ON_2fPointArray *)local_af8.m_xform[0][2];
            local_878.super_IClosestPointMapper._vptr_IClosestPointMapper =
                 (_func_int **)local_af8.m_xform[0][0];
            local_878.m_mesh = (ON_Mesh *)local_af8.m_xform[0][1];
            ON_3fPoint::Set((ON_3fPoint *)((long)&T->m_a->x + lVar10),(float)local_af8.m_xform[0][0]
                            ,(float)local_af8.m_xform[0][1],(float)local_af8.m_xform[0][2]);
            lVar12 = lVar12 + 1;
            lVar10 = lVar10 + 0xc;
          } while (lVar12 < local_b28.m_count);
        }
        if (__s != (int *)0x0) {
          memset(__s,0,new_capacity * 4);
        }
      }
    }
    ON_SimpleArray<ON_2fPoint>::~ON_SimpleArray(&local_b28);
  }
  else if ((local_b80 == (ON_3fVector *)0x0) ||
          ((this->m_projection != ray_projection &&
           ((wcsbox_projection < this->m_type || ((0x1068U >> (this->m_type & 0x1f) & 1) == 0))))))
  {
    if (m == (double *)0x0) {
      lVar10 = 0;
      uVar18 = 0;
      do {
        ON_3dPoint::operator=(&local_b68,(ON_3fPoint *)((long)&pOVar11->x + lVar10));
        iVar9 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                          (this,&local_b68,&local_b48,&local_b10);
        ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar10),&local_b10);
        if (__s != (int *)0x0) {
          __s[uVar18] = iVar9;
        }
        uVar18 = uVar18 + 1;
        lVar10 = lVar10 + 0xc;
      } while (new_capacity != uVar18);
    }
    else {
      lVar10 = 0;
      piVar16 = __s;
      do {
        dVar5 = (double)*(float *)((long)&pOVar11->x + lVar10);
        dVar19 = (double)*(float *)((long)&pOVar11->y + lVar10);
        dVar20 = (double)*(float *)((long)&pOVar11->z + lVar10);
        dVar21 = m[0xe] * dVar20 + m[0xc] * dVar5 + m[0xd] * dVar19 + m[0xf];
        uVar18 = -(ulong)(dVar21 != 0.0);
        local_b68.z = (double)(~uVar18 & 0x3ff0000000000000 | (ulong)(1.0 / dVar21) & uVar18);
        local_b68.x = local_b68.z * (m[3] + dVar20 * m[2] + dVar5 * *m + dVar19 * m[1]);
        local_b68.y = local_b68.z * (m[7] + dVar20 * m[6] + dVar5 * m[4] + dVar19 * m[5]);
        local_b68.z = (dVar20 * m[10] + dVar5 * m[8] + dVar19 * m[9] + m[0xb]) * local_b68.z;
        iVar9 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                          (this,&local_b68,&local_b48,&local_b10);
        ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar10),&local_b10);
        if (__s != (int *)0x0) {
          *piVar16 = iVar9;
        }
        piVar16 = piVar16 + 1;
        lVar10 = lVar10 + 0xc;
      } while (new_capacity * 0xc != lVar10);
    }
  }
  else if (m == (double *)0x0 || m_00 == (double *)0x0) {
    lVar10 = 0;
    uVar18 = 0;
    do {
      ON_3dPoint::operator=(&local_b68,(ON_3fPoint *)((long)&pOVar11->x + lVar10));
      ON_3dVector::operator=(&local_b48,(ON_3fVector *)((long)&local_b80->x + lVar10));
      iVar9 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                        (this,&local_b68,&local_b48,&local_b10);
      ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar10),&local_b10);
      if (__s != (int *)0x0) {
        __s[uVar18] = iVar9;
      }
      uVar18 = uVar18 + 1;
      lVar10 = lVar10 + 0xc;
    } while (new_capacity != uVar18);
  }
  else {
    lVar10 = 0;
    piVar16 = __s;
    do {
      dVar5 = (double)*(float *)((long)&pOVar11->x + lVar10);
      dVar20 = (double)*(float *)((long)&pOVar11->y + lVar10);
      dVar19 = (double)*(float *)((long)&pOVar11->z + lVar10);
      dVar21 = m[0xe] * dVar19 + m[0xc] * dVar5 + m[0xd] * dVar20 + m[0xf];
      uVar18 = -(ulong)(dVar21 != 0.0);
      local_b68.z = (double)(~uVar18 & 0x3ff0000000000000 | (ulong)(1.0 / dVar21) & uVar18);
      local_b68.x = local_b68.z * (m[3] + dVar19 * m[2] + dVar5 * *m + dVar20 * m[1]);
      local_b68.y = local_b68.z * (m[7] + dVar19 * m[6] + dVar5 * m[4] + dVar20 * m[5]);
      local_b68.z = (dVar19 * m[10] + dVar5 * m[8] + dVar20 * m[9] + m[0xb]) * local_b68.z;
      dVar5 = (double)*(float *)((long)&local_b80->x + lVar10);
      dVar19 = (double)*(float *)((long)&local_b80->y + lVar10);
      dVar20 = (double)*(float *)((long)&local_b80->z + lVar10);
      local_b48.x = dVar20 * m[2] + dVar5 * *m + dVar19 * m[1];
      local_b48.y = dVar20 * m[6] + dVar5 * m[4] + dVar19 * m[5];
      local_b48.z = m[8] * dVar5 + m[9] * dVar19 + m[10] * dVar20;
      ON_3dVector::Unitize(&local_b48);
      iVar9 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                        (this,&local_b68,&local_b48,&local_b10);
      ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar10),&local_b10);
      if (__s != (int *)0x0) {
        *piVar16 = iVar9;
      }
      piVar16 = piVar16 + 1;
      lVar10 = lVar10 + 0xc;
    } while (new_capacity * 0xc != lVar10);
  }
  return true;
}

Assistant:

bool ON_TextureMapping::GetTextureCoordinates(
          const ON_Mesh& mesh,
          ON_SimpleArray<ON_3fPoint>& T,
          const ON_Xform* mesh_xform,
          bool bLazy,
          ON_SimpleArray<int>* Tside
          ) const
{
  if ( Tside )
    Tside->SetCount(0);

  int i;
  const int vcnt = mesh.m_V.Count();
  if ( vcnt <= 0 )
    return false;

  if ( bLazy )
  {
    int tci, tccount = mesh.m_TC.Count();
    for ( tci = 0; tci < tccount; tci++ )
    {
      if ( vcnt == mesh.m_TC[tci].m_T.Count() )
      {
        if ( HasMatchingTextureCoordinates(mesh.m_TC[tci].m_tag,mesh_xform) )
        {
          T = mesh.m_TC[tci].m_T;
          return true;
        }
      }
    }

    if ( HasMatchingTextureCoordinates(mesh,mesh_xform ) )
    {
      T.Reserve(vcnt);
      T.SetCount(vcnt);
      const ON_2fPoint* f = mesh.m_T.Array();
      ON_3fPoint* d = T.Array();
      for ( i = vcnt; i--; f++, d++ )
      {
        d->x = f->x;
        d->y = f->y;
        d->z = 0.0f;
      }
      return true;
    }
  }

	bool rc = false;

  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
  {
    // uv textures from surface parameterization
    T.Reserve(vcnt);
    T.SetCount(vcnt);
    T.Zero();
    rc = GetSPTCHelper(mesh,*this,&T[0].x,3);
	}
  else
  {
    ON_3dPoint  P, tc;
		ON_3dVector N(0.0,0.0,0.0);

		const ON_3fPoint*  mesh_V = mesh.m_V.Array();
		const ON_3fVector* mesh_N = mesh.HasVertexNormals()
                              ? mesh.m_N.Array()
                              : 0;

    T.Reserve(vcnt);
    T.SetCount(vcnt);

    int* Tsd = 0;
    if ( Tside )
    {
      Tside->Reserve(vcnt);
      Tside->SetCount(vcnt);
      Tsd = Tside->Array();
      memset(Tsd,0,vcnt*sizeof(Tsd[0]));
    }

    ON_Xform P_xform(ON_Xform::IdentityTransformation), N_xform(ON_Xform::IdentityTransformation);
    const double* PT = 0;
    const double* NT = 0;
    if ( mesh_xform )
    {
      if ( mesh_xform->IsZero() || mesh_xform->IsIdentity() )
      {
        // ignore transformation
        mesh_xform = 0;
      }
      else if ( 0.0 != mesh_xform->GetMappingXforms(P_xform,N_xform) )
      {
        PT = &P_xform[0][0];
        NT = &N_xform[0][0];
      }
      else
      {
        mesh_xform = 0;
      }
    }

    const float* f;
    double w;
    int sd;

		if (ON_TextureMapping::PROJECTION::clspt_projection == m_projection
      && (ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type || ON_TextureMapping::TYPE::brep_mapping_primitive == m_type)
      && nullptr != m_mapping_primitive)
		{
      rc = false;
			ON_2fPointArray temp_tcs;

			// Jussi, 11-Nov-2010: Apply mapping primitive transformations first

			ON_Xform matP(m_Pxyz);
			ON_Xform matN(m_Nxyz);

			if (nullptr != PT)
				matP = matP * ON_Xform(PT);

			if (nullptr != NT)
				matN = matN * ON_Xform(NT);

			if (ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type)
			{
				const ON_Mesh * pMesh = CustomMappingMeshPrimitive();
				if (nullptr != pMesh)
				{
					CMeshClosestPointMapper meshMapper(*pMesh, pMesh->m_T, mesh.GetRenderMeshInfo(), matP);
					rc = ProjectTextureCoordinates(meshMapper, mesh, temp_tcs, &matP.m_xform[0][0], &matN.m_xform[0][0]);
				}
			}

      if (rc)
			{
				for (int i_local = 0; i_local < temp_tcs.Count(); i_local++)
				{
					// Jussi, 11-Nov-2010: Fix for the problem reported by Michael Fritzsche: Custom mesh mapping does not
					// obey uvw repeat settings. Solution: multiply the 'mapping coordinate' with m_uvw to
					// get the final texture coordinate.

					ON_3dPoint ptT(temp_tcs[i_local].x, temp_tcs[i_local].y, 0.0);
					ptT = m_uvw * ptT;
					T[i_local].Set((float)ptT.x, (float)ptT.y, (float)ptT.z);
				}

				if (nullptr != Tsd)
				{
					memset(Tsd, 0, vcnt * sizeof(int));
				}
			}
		}
		else if ( mesh_N &&
          (   ON_TextureMapping::PROJECTION::ray_projection == m_projection
           || ON_TextureMapping::TYPE::box_mapping == m_type
           || ON_TextureMapping::TYPE::cylinder_mapping == m_type
           || ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type
           || ON_TextureMapping::TYPE::wcsbox_projection == m_type
		   )
        )
  	{
			// calculation uses mesh vertex normal
      if ( PT && NT )
      {
        // need to transform vertex and normal
        // before calculating texture coordinates
			  for (i = 0; i < vcnt; i++)
			  {
          f = &mesh_V[i].x;
				  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
          w = (0.0 != w) ? 1.0/w : 1.0;
				  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
				  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
				  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);

          f = &mesh_N[i].x;
          N.x = PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2];
				  N.y = PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2];
				  N.z = PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2];
          N.Unitize();
				  sd = Evaluate(P,N,&tc);
				  T[i] = tc;
          if ( Tsd ) Tsd[i] = sd;
			  }
      }
			else
      {
        // mesh vertex and normal are ok
			  for (i = 0; i < vcnt; i++)
			  {
				  P = mesh_V[i];
				  N = mesh_N[i];
				  sd = Evaluate(P,N,&tc);
				  T[i] = tc;
          if ( Tsd ) Tsd[i] = sd;
			  }
      }
		}
		else if ( PT )
    {
      // normal is not used
      // mesh vertex needs to be transformed
      for ( i = 0; i < vcnt; i++ )
      {
        f = &mesh_V[i].x;
			  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
        w = (0.0 != w) ? 1.0/w : 1.0;
			  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
			  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
			  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);
        sd = Evaluate(P,N,&tc);
			  T[i] = tc;
        if ( Tsd )
          Tsd[i] = sd;
		  }
    }
    else
		{
			// normal is not used and mesh vertex is ok
			for ( i = 0; i < vcnt; i++ )
			{
				P = mesh_V[i];
				sd = Evaluate(P,N,&tc);
				T[i] = tc;
				if ( Tsd )
					Tsd[i] = sd;
			}
    }
    rc = true;
	}

	return rc;
}